

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

void __thiscall
gl4cts::TextureViewTestViewSampling::initPerSampleFillerProgramObject
          (TextureViewTestViewSampling *this)

{
  undefined4 uVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  GLint GVar5;
  undefined4 extraout_var;
  ulong uVar7;
  TestError *pTVar8;
  long lVar9;
  GLint link_status;
  string fs_body_string;
  char *fs_body_string_raw_ptr;
  stringstream n_max_samples_sstream;
  int local_204;
  long *local_200;
  GLuint local_1f8;
  long local_1f0 [2];
  long *local_1e0 [2];
  long local_1d0 [2];
  long *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  long lVar6;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_per_sample_filler_fs_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8dd9);
  this->m_per_sample_filler_gs_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_per_sample_filler_vs_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1660);
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  this->m_per_sample_filler_po_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1663);
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e0,
             "#version 400\n\nuniform vec4 reference_colors[N_MAX_SAMPLES];\n\nout vec4 result;\n\nvoid main()\n{\n    result = reference_colors[gl_SampleID];\n}\n"
             ,"");
  local_1c0 = (long *)0x0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::ostream::operator<<(local_1a8,this->m_max_color_texture_samples_gl_value);
  uVar7 = std::__cxx11::string::find((char *)local_1e0,0x1aa9d08,0);
  if (uVar7 != 0xffffffffffffffff) {
    do {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::replace((ulong)local_1e0,uVar7,(char *)0xd,(ulong)local_200);
      if (local_200 != local_1f0) {
        operator_delete(local_200,local_1f0[0] + 1);
      }
      uVar7 = std::__cxx11::string::find((char *)local_1e0,0x1aa9d08,0);
    } while (uVar7 != 0xffffffffffffffff);
  }
  local_1c0 = local_1e0[0];
  (**(code **)(lVar6 + 0x12b8))(this->m_per_sample_filler_fs_id,1,&local_1c0,0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1680);
  (**(code **)(lVar6 + 0x12b8))
            (this->m_per_sample_filler_gs_id,1,&initPerSampleFillerProgramObject::gs_body,0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x16a1);
  (**(code **)(lVar6 + 0x12b8))
            (this->m_per_sample_filler_vs_id,1,&initPerSampleFillerProgramObject::vs_body,0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x16ac);
  (**(code **)(lVar6 + 0x10))(this->m_per_sample_filler_po_id,this->m_per_sample_filler_fs_id);
  (**(code **)(lVar6 + 0x10))(this->m_per_sample_filler_po_id,this->m_per_sample_filler_gs_id);
  (**(code **)(lVar6 + 0x10))(this->m_per_sample_filler_po_id,this->m_per_sample_filler_vs_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glAttachShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x16b2);
  local_200 = *(long **)&this->m_per_sample_filler_fs_id;
  local_1f8 = this->m_per_sample_filler_vs_id;
  lVar9 = 0;
  do {
    local_204 = 0;
    uVar1 = *(undefined4 *)((long)&local_200 + lVar9 * 4);
    (**(code **)(lVar6 + 0x248))(uVar1);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x16be);
    (**(code **)(lVar6 + 0xa70))(uVar1,0x8b81,&local_204);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGetShaderiV() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x16c1);
    if (local_204 != 1) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Shader compilation failed.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x16c5);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_204 = 0;
  (**(code **)(lVar6 + 0xce8))(this->m_per_sample_filler_po_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glLinkProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x16cd);
  (**(code **)(lVar6 + 0x9d8))(this->m_per_sample_filler_po_id,0x8b82,&local_204);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGetProgramiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x16d0);
  if (local_204 == 1) {
    GVar5 = (**(code **)(lVar6 + 0xb48))(this->m_per_sample_filler_po_id,"layer_id");
    this->m_per_sample_filler_po_layer_id_location = GVar5;
    iVar2 = (**(code **)(lVar6 + 0xb48))(this->m_per_sample_filler_po_id,"reference_colors[0]");
    this->m_per_sample_filler_po_reference_colors_location = iVar2;
    if (this->m_per_sample_filler_po_layer_id_location == -1) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"layer_id uniform is considered inactive which is invalid",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x16de);
    }
    else {
      if (iVar2 != -1) {
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_1e0[0] != local_1d0) {
          operator_delete(local_1e0[0],local_1d0[0] + 1);
        }
        return;
      }
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"reference_colors uniform is considered inactive which is invalid",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x16e3);
    }
  }
  else {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Program linking failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x16d4);
  }
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureViewTestViewSampling::initPerSampleFillerProgramObject()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Sanity checks: GL_MAX_COLOR_TEXTURE_SAMPLES is not 0 */
	DE_ASSERT(m_max_color_texture_samples_gl_value != 0);

	/* Generate program and shader objects */
	m_per_sample_filler_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_per_sample_filler_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_per_sample_filler_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	m_per_sample_filler_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Configure fragment shader's body */
	static const char* fs_body = "#version 400\n"
								 "\n"
								 "uniform vec4 reference_colors[N_MAX_SAMPLES];\n"
								 "\n"
								 "out vec4 result;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    result = reference_colors[gl_SampleID];\n"
								 "}\n";
	std::string		  fs_body_string		 = fs_body;
	const char*		  fs_body_string_raw_ptr = DE_NULL;
	std::stringstream n_max_samples_sstream;
	const char*		  n_max_samples_token = "N_MAX_SAMPLES";
	std::size_t		  token_location	  = std::string::npos;

	n_max_samples_sstream << m_max_color_texture_samples_gl_value;

	while ((token_location = fs_body_string.find(n_max_samples_token)) != std::string::npos)
	{
		fs_body_string.replace(token_location, strlen(n_max_samples_token), n_max_samples_sstream.str());
	}

	fs_body_string_raw_ptr = fs_body_string.c_str();

	gl.shaderSource(m_per_sample_filler_fs_id, 1 /* count */, &fs_body_string_raw_ptr, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	/* Configure geometry shader's body */
	static const char* gs_body = "#version 400\n"
								 "\n"
								 "layout(points)                           in;\n"
								 "layout(triangle_strip, max_vertices = 4) out;\n"
								 "\n"
								 "uniform int layer_id;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    gl_Layer    = layer_id;\n"
								 "    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
								 "    EmitVertex();\n"
								 "\n"
								 "    gl_Layer    = layer_id;\n"
								 "    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
								 "    EmitVertex();\n"
								 "\n"
								 "    gl_Layer    = layer_id;\n"
								 "    gl_Position = vec4( 1.0, -1.0, 0.0, 1.0);\n"
								 "    EmitVertex();\n"
								 "\n"
								 "    gl_Layer    = layer_id;\n"
								 "    gl_Position = vec4( 1.0,  1.0, 0.0, 1.0);\n"
								 "    EmitVertex();\n"
								 "\n"
								 "    EndPrimitive();\n"
								 "\n"
								 "}\n";

	gl.shaderSource(m_per_sample_filler_gs_id, 1 /* count */, &gs_body, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	/* Configure vertex shader */
	static const char* vs_body = "#version 400\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
								 "}\n";

	gl.shaderSource(m_per_sample_filler_vs_id, 1 /* count */, &vs_body, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	/* Attach the shaders to the program object */
	gl.attachShader(m_per_sample_filler_po_id, m_per_sample_filler_fs_id);
	gl.attachShader(m_per_sample_filler_po_id, m_per_sample_filler_gs_id);
	gl.attachShader(m_per_sample_filler_po_id, m_per_sample_filler_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	/* Compile the shaders */
	const glw::GLuint  so_ids[] = { m_per_sample_filler_fs_id, m_per_sample_filler_gs_id, m_per_sample_filler_vs_id };
	const unsigned int n_so_ids = sizeof(so_ids) / sizeof(so_ids[0]);

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		glw::GLint  compile_status = GL_FALSE;
		glw::GLuint so_id		   = so_ids[n_so_id];

		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiV() call failed.");

		if (compile_status != GL_TRUE)
		{
			TCU_FAIL("Shader compilation failed.");
		}
	} /* for (all shader objects) */

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(m_per_sample_filler_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_per_sample_filler_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed.");
	}

	/* Retrieve uniform locations */
	m_per_sample_filler_po_layer_id_location = gl.getUniformLocation(m_per_sample_filler_po_id, "layer_id");
	m_per_sample_filler_po_reference_colors_location =
		gl.getUniformLocation(m_per_sample_filler_po_id, "reference_colors[0]");

	if (m_per_sample_filler_po_layer_id_location == -1)
	{
		TCU_FAIL("layer_id uniform is considered inactive which is invalid");
	}

	if (m_per_sample_filler_po_reference_colors_location == -1)
	{
		TCU_FAIL("reference_colors uniform is considered inactive which is invalid");
	}
}